

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

archive * archive_match_new(void)

{
  archive_match *a;
  archive *local_8;
  
  local_8 = (archive *)calloc(1,0x1d8);
  if (local_8 == (archive *)0x0) {
    local_8 = (archive *)0x0;
  }
  else {
    local_8->magic = 0xcad11c9;
    local_8->state = 1;
    match_list_init((match_list *)&local_8[1].file_count);
    match_list_init((match_list *)&local_8[1].vtable);
    __archive_rb_tree_init((archive_rb_tree *)&local_8[2].error_string.buffer_length,&rb_ops_mbs);
    entry_list_init((entry_list *)&local_8[2].current_codepage);
    match_list_init((match_list *)&local_8[3].error);
    match_list_init((match_list *)&local_8[3].current_codepage);
    time((time_t *)&local_8[1].current_code);
  }
  return local_8;
}

Assistant:

struct archive *
archive_match_new(void)
{
	struct archive_match *a;

	a = (struct archive_match *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_MATCH_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	match_list_init(&(a->inclusions));
	match_list_init(&(a->exclusions));
	__archive_rb_tree_init(&(a->exclusion_tree), &rb_ops_mbs);
	entry_list_init(&(a->exclusion_entry_list));
	match_list_init(&(a->inclusion_unames));
	match_list_init(&(a->inclusion_gnames));
	time(&a->now);
	return (&(a->archive));
}